

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<void(*)(unsigned_char*,unsigned_char_const*,int,int,unsigned_char_const*,int),BLOCK_SIZE>
::IteratorImpl<testing::internal::IndexSequence<0ul,1ul>>::AdvanceIfEnd<1ul>
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this)

{
  bool bVar1;
  __tuple_element_t<1UL,_tuple<ParamIterator<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int)>,_ParamIterator<BLOCK_SIZE>_>_>
  *this_00;
  size_t NextI;
  bool last;
  ParamIterator<BLOCK_SIZE> *in_stack_ffffffffffffffc8;
  ParamIterator<BLOCK_SIZE> *in_stack_ffffffffffffffd0;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 uVar2;
  
  std::
  get<1ul,testing::internal::ParamIterator<void(*)(unsigned_char*,unsigned_char_const*,int,int,unsigned_char_const*,int)>,testing::internal::ParamIterator<BLOCK_SIZE>>
            ((tuple<testing::internal::ParamIterator<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>_>
              *)0xad13dc);
  std::
  get<1ul,testing::internal::ParamIterator<void(*)(unsigned_char*,unsigned_char_const*,int,int,unsigned_char_const*,int)>,testing::internal::ParamIterator<BLOCK_SIZE>>
            ((tuple<testing::internal::ParamIterator<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>_>
              *)0xad13ef);
  bVar1 = ParamIterator<BLOCK_SIZE>::operator!=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8)
  ;
  if (!bVar1) {
    uVar2 = 0;
    this_00 = std::
              get<1ul,testing::internal::ParamIterator<void(*)(unsigned_char*,unsigned_char_const*,int,int,unsigned_char_const*,int)>,testing::internal::ParamIterator<BLOCK_SIZE>>
                        ((tuple<testing::internal::ParamIterator<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>_>
                          *)0xad1429);
    std::
    get<1ul,testing::internal::ParamIterator<void(*)(unsigned_char*,unsigned_char_const*,int,int,unsigned_char_const*,int)>,testing::internal::ParamIterator<BLOCK_SIZE>>
              ((tuple<testing::internal::ParamIterator<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>_>
                *)0xad143c);
    ParamIterator<BLOCK_SIZE>::operator=(this_00,in_stack_ffffffffffffffc8);
    std::
    get<0ul,testing::internal::ParamIterator<void(*)(unsigned_char*,unsigned_char_const*,int,int,unsigned_char_const*,int)>,testing::internal::ParamIterator<BLOCK_SIZE>>
              ((tuple<testing::internal::ParamIterator<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>_>
                *)0xad1457);
    ParamIterator<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int)>
    ::operator++((ParamIterator<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int)>
                  *)this_00);
    AdvanceIfEnd<0ul>((IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *)
                      CONCAT17(uVar2,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void AdvanceIfEnd() {
      if (std::get<ThisI>(current_) != std::get<ThisI>(end_)) return;

      bool last = ThisI == 0;
      if (last) {
        // We are done. Nothing else to propagate.
        return;
      }

      constexpr size_t NextI = ThisI - (ThisI != 0);
      std::get<ThisI>(current_) = std::get<ThisI>(begin_);
      ++std::get<NextI>(current_);
      AdvanceIfEnd<NextI>();
    }